

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdGetPsbtPubkeyListData
              (void *handle,void *pubkey_list_handle,uint32_t index,char **pubkey,char **pubkey_hex)

{
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *this;
  reference pvVar1;
  char *pcVar2;
  char *pcVar3;
  CfdException *pCVar4;
  char *work_pubkey;
  Pubkey pubkey_obj;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_208;
  ExtPubkey extkey;
  value_type key;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&key,"PsbtPubkeyList",(allocator *)&extkey);
  cfd::capi::CheckBuffer(pubkey_list_handle,(string *)&key);
  std::__cxx11::string::~string((string *)&key);
  if (pubkey == (char **)0x0) {
    key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x728;
    key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdGetPsbtPubkeyListData";
    cfd::core::logger::warn<>((CfdSourceLocation *)&key,"pubkey is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&key,"Failed to parameter. pubkey is null.",(allocator *)&extkey);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&key);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  this = *(vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> **)
          ((long)pubkey_list_handle + 0x18);
  if (this != (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x0) {
    if ((ulong)index <
        (ulong)(((long)(this->
                       super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->
                      super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>).
                      _M_impl.super__Vector_impl_data._M_start) / 0x150)) {
      pvVar1 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::at
                         (this,(ulong)index);
      cfd::core::KeyData::KeyData(&key,pvVar1);
      if (*(char *)((long)pubkey_list_handle + 0x11) == '\x01') {
        cfd::core::KeyData::GetExtPubkey(&extkey,&key);
        cfd::core::ExtPubkey::ToString_abi_cxx11_((string *)&pubkey_obj,&extkey);
        pcVar2 = cfd::capi::CreateString((string *)&pubkey_obj);
        std::__cxx11::string::~string((string *)&pubkey_obj);
        if (pubkey_hex == (char **)0x0) {
          pcVar3 = (char *)0x0;
        }
        else {
          cfd::core::ExtPubkey::GetData((ByteData *)&local_208,&extkey);
          cfd::core::ByteData::GetHex_abi_cxx11_((string *)&pubkey_obj,(ByteData *)&local_208);
          pcVar3 = cfd::capi::CreateString((string *)&pubkey_obj);
          std::__cxx11::string::~string((string *)&pubkey_obj);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_208);
        }
        cfd::core::ExtPubkey::~ExtPubkey(&extkey);
      }
      else {
        cfd::core::KeyData::GetPubkey(&pubkey_obj,&key);
        cfd::core::Pubkey::GetHex_abi_cxx11_((string *)&extkey,&pubkey_obj);
        pcVar2 = cfd::capi::CreateString((string *)&extkey);
        std::__cxx11::string::~string((string *)&extkey);
        if (pubkey_hex == (char **)0x0) {
          pcVar3 = (char *)0x0;
        }
        else {
          cfd::core::Pubkey::GetHex_abi_cxx11_((string *)&extkey,&pubkey_obj);
          pcVar3 = cfd::capi::CreateString((string *)&extkey);
          std::__cxx11::string::~string((string *)&extkey);
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey_obj);
      }
      *pubkey = pcVar2;
      if (pubkey_hex != (char **)0x0) {
        *pubkey_hex = pcVar3;
      }
      cfd::core::KeyData::~KeyData(&key);
      return 0;
    }
    key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x734;
    key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdGetPsbtPubkeyListData";
    cfd::core::logger::warn<>((CfdSourceLocation *)&key,"out of range error.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&key,"Failed to out of range.",(allocator *)&extkey);
    cfd::core::CfdException::CfdException(pCVar4,kCfdOutOfRangeError,(string *)&key);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
  key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x72e;
  key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "CfdGetPsbtPubkeyListData";
  cfd::core::logger::warn<>((CfdSourceLocation *)&key,"key_list is null.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&key,"Failed to handle statement. key_list is null.",(allocator *)&extkey);
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&key);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetPsbtPubkeyListData(
    void* handle, void* pubkey_list_handle, uint32_t index, char** pubkey,
    char** pubkey_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_pubkey = nullptr;
  char* work_pubkey_hex = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(pubkey_list_handle, kPrefixPsbtPubkeyList);
    CfdCapiPsbtPubkeyListHandle* list_handle =
        static_cast<CfdCapiPsbtPubkeyListHandle*>(pubkey_list_handle);
    if (pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null.");
    }
    if (list_handle->key_list == nullptr) {
      warn(CFD_LOG_SOURCE, "key_list is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. key_list is null.");
    }
    if (index >= list_handle->key_list->size()) {
      warn(CFD_LOG_SOURCE, "out of range error.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError, "Failed to out of range.");
    }

    auto key = list_handle->key_list->at(index);
    if (list_handle->has_xpub_list) {
      auto extkey = key.GetExtPubkey();
      work_pubkey = CreateString(extkey.ToString());
      if (pubkey_hex != nullptr) {
        work_pubkey_hex = CreateString(extkey.GetData().GetHex());
      }
    } else {
      auto pubkey_obj = key.GetPubkey();
      work_pubkey = CreateString(pubkey_obj.GetHex());
      if (pubkey_hex != nullptr) {
        work_pubkey_hex = CreateString(pubkey_obj.GetHex());
      }
    }

    *pubkey = work_pubkey;
    if (pubkey_hex != nullptr) *pubkey_hex = work_pubkey_hex;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_pubkey, &work_pubkey_hex);
  return result;
}